

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextInitialize(ImGuiContext *ctx)

{
  int *piVar1;
  ImGuiSettingsHandler *pIVar2;
  ImU32 IVar3;
  int iVar4;
  ImGuiDockContext *pIVar5;
  ImGuiSettingsHandler *__dest;
  int iVar6;
  int iVar7;
  
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  pIVar5 = (ImGuiDockContext *)(*GImAllocatorAllocFunc)(0x38,GImAllocatorUserData);
  (pIVar5->Nodes).Data.Size = 0;
  (pIVar5->Nodes).Data.Capacity = 0;
  (pIVar5->Nodes).Data.Data = (ImGuiStoragePair *)0x0;
  (pIVar5->Requests).Size = 0;
  (pIVar5->Requests).Capacity = 0;
  (pIVar5->Requests).Data = (ImGuiDockRequest *)0x0;
  (pIVar5->SettingsNodes).Size = 0;
  (pIVar5->SettingsNodes).Capacity = 0;
  (pIVar5->SettingsNodes).Data = (ImGuiDockNodeSettings *)0x0;
  pIVar5->WantFullRebuild = false;
  ctx->DockContext = pIVar5;
  IVar3 = ImHashStr("Docking",0,0);
  iVar4 = (ctx->SettingsHandlers).Size;
  if (iVar4 == (ctx->SettingsHandlers).Capacity) {
    if (iVar4 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar4 / 2 + iVar4;
    }
    iVar7 = iVar4 + 1;
    if (iVar4 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiSettingsHandler *)
             (*GImAllocatorAllocFunc)((long)iVar7 * 0x30,GImAllocatorUserData);
    pIVar2 = (ctx->SettingsHandlers).Data;
    if (pIVar2 != (ImGuiSettingsHandler *)0x0) {
      memcpy(__dest,pIVar2,(long)(ctx->SettingsHandlers).Size * 0x30);
      pIVar2 = (ctx->SettingsHandlers).Data;
      if ((pIVar2 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (ctx->SettingsHandlers).Data = __dest;
    (ctx->SettingsHandlers).Capacity = iVar7;
    iVar4 = (ctx->SettingsHandlers).Size;
  }
  else {
    __dest = (ctx->SettingsHandlers).Data;
  }
  __dest[iVar4].TypeName = "Docking";
  __dest[iVar4].TypeHash = IVar3;
  *(undefined4 *)&__dest[iVar4].field_0xc = 0;
  __dest[iVar4].ReadOpenFn = DockSettingsHandler_ReadOpen;
  __dest[iVar4].ReadLineFn = DockSettingsHandler_ReadLine;
  __dest[iVar4].WriteAllFn = DockSettingsHandler_WriteAll;
  __dest[iVar4].UserData = (void *)0x0;
  (ctx->SettingsHandlers).Size = (ctx->SettingsHandlers).Size + 1;
  return;
}

Assistant:

void ImGui::DockContextInitialize(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(g.DockContext == NULL);
    g.DockContext = IM_NEW(ImGuiDockContext)();

    // Add .ini handle for persistent docking data
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Docking";
    ini_handler.TypeHash = ImHashStr("Docking");
    ini_handler.ReadOpenFn = DockSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = DockSettingsHandler_ReadLine;
    ini_handler.WriteAllFn = DockSettingsHandler_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);
}